

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O0

aspa_record * aspa_array_search(aspa_array *array,uint32_t customer_asn)

{
  uint uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  uint32_t center_value;
  size_t center;
  size_t right;
  size_t left;
  uint32_t customer_asn_local;
  aspa_array *array_local;
  
  if ((array->size == 0) || (array->capacity == 0)) {
    array_local = (aspa_array *)0x0;
  }
  else {
    right = 0;
    center = (size_t)(array->size - 1);
    while (right <= center) {
      uVar2 = right + center >> 1;
      uVar1 = array->data[uVar2].customer_asn;
      if (uVar1 == customer_asn) {
        array_local = (aspa_array *)(array->data + uVar2);
        goto LAB_0011ece4;
      }
      if (uVar1 < customer_asn) {
        right = uVar2 + 1;
      }
      else {
        if (uVar2 == 0) {
          array_local = (aspa_array *)0x0;
          goto LAB_0011ece4;
        }
        center = uVar2 - 1;
      }
    }
    array_local = (aspa_array *)0x0;
  }
LAB_0011ece4:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return (aspa_record *)array_local;
}

Assistant:

struct aspa_record *aspa_array_search(struct aspa_array *array, uint32_t customer_asn)
{
	// if the array is empty we return an error
	if (array->size == 0 || array->capacity == 0)
		return NULL;

	// left and right bound of our search space
	register size_t left = 0;
	register size_t right = array->size - 1;

	// we stop if right and left crossed
	while (left <= right) {
		// current center
		size_t center = (left + right) >> 1;
		uint32_t center_value = array->data[center].customer_asn;

		// success found the value
		if (center_value == customer_asn) {
			return &array->data[center];

			// value should be on the right side
		} else if (center_value < customer_asn) {
			left = center + 1;

			// value should be on the left side
		} else if (center == 0) {
			// value cannot be left of index 0
			return NULL;
		} else {
			right = center - 1;
		}
	}

	// element not found
	return NULL;
}